

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t process_head_file(archive_read *a,rar5 *rar,archive_entry *entry,size_t block_flags)

{
  wchar_t wVar1;
  void *pvVar2;
  char *__dest;
  ulong local_20c8;
  char *pcStack_20b8;
  wchar_t ret;
  char *ptr;
  char *fflags_text;
  mode_t mode;
  uint8_t *new_window_buf;
  size_t edata_size;
  uint8_t *p;
  char name_utf8_buf [8192];
  wchar_t c_version;
  wchar_t c_method;
  uint32_t crc;
  uint32_t mtime;
  uint64_t window_size;
  uint64_t unpacked_size;
  size_t name_size;
  size_t host_os;
  size_t compression_info;
  size_t file_attr;
  size_t file_flags;
  size_t data_size;
  ssize_t extra_data_size;
  size_t block_flags_local;
  archive_entry *entry_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  data_size = 0;
  file_flags = 0;
  file_attr = 0;
  compression_info = 0;
  host_os = 0;
  name_size = 0;
  unpacked_size = 0;
  c_method = L'\0';
  c_version = L'\0';
  name_utf8_buf[0x1ffc] = '\0';
  name_utf8_buf[0x1ffd] = '\0';
  name_utf8_buf[0x1ffe] = '\0';
  name_utf8_buf[0x1fff] = '\0';
  name_utf8_buf[0x1ff8] = '\0';
  name_utf8_buf[0x1ff9] = '\0';
  name_utf8_buf[0x1ffa] = '\0';
  name_utf8_buf[0x1ffb] = '\0';
  extra_data_size = block_flags;
  block_flags_local = (size_t)entry;
  entry_local = (archive_entry *)rar;
  rar_local = (rar5 *)a;
  archive_entry_clear(entry);
  if (((byte)(entry_local->ae_stat).aest_mtime >> 2 & 1) == 0) {
    reset_file_context((rar5 *)entry_local);
  }
  if ((extra_data_size & 1U) != 0) {
    new_window_buf = (uint8_t *)0x0;
    wVar1 = read_var_sized((archive_read *)rar_local,(size_t *)&new_window_buf,(size_t *)0x0);
    if (wVar1 == L'\0') {
      return L'\x01';
    }
    data_size = (size_t)new_window_buf;
  }
  if ((extra_data_size & 2U) == 0) {
    entry_local[0xf].ae_stat.aest_rdev = 0;
    archive_set_error((archive *)rar_local,0x54,"no data found in file/service block");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    wVar1 = read_var_sized((archive_read *)rar_local,&file_flags,(size_t *)0x0);
    if (wVar1 == L'\0') {
      a_local._4_4_ = L'\x01';
    }
    else {
      entry_local[0xf].ae_stat.aest_rdev = file_flags;
      wVar1 = read_var_sized((archive_read *)rar_local,&file_attr,(size_t *)0x0);
      if (wVar1 == L'\0') {
        a_local._4_4_ = L'\x01';
      }
      else {
        wVar1 = read_var((archive_read *)rar_local,&window_size,(uint64_t *)0x0);
        if (wVar1 == L'\0') {
          a_local._4_4_ = L'\x01';
        }
        else if ((file_attr & 8) == 0) {
          *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s =
               *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s & 0xf7 |
               ((file_attr & 1) != 0) << 3;
          wVar1 = read_var_sized((archive_read *)rar_local,&compression_info,(size_t *)0x0);
          if (wVar1 == L'\0') {
            a_local._4_4_ = L'\x01';
          }
          else if (((file_attr & 2) == 0) ||
                  (wVar1 = read_u32((archive_read *)rar_local,(uint32_t *)&c_method), wVar1 != L'\0'
                  )) {
            if (((file_attr & 4) == 0) ||
               (wVar1 = read_u32((archive_read *)rar_local,(uint32_t *)&c_version), wVar1 != L'\0'))
            {
              wVar1 = read_var_sized((archive_read *)rar_local,&host_os,(size_t *)0x0);
              if (wVar1 == L'\0') {
                a_local._4_4_ = L'\x01';
              }
              else {
                name_utf8_buf._8188_4_ = (uint)(host_os >> 7) & 7;
                name_utf8_buf._8184_4_ = (uint)host_os & 0x3f;
                if ((*(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s >> 3 & 1) == 0) {
                  local_20c8 = 0x20000L << ((byte)(host_os >> 10) & 0xf);
                }
                else {
                  local_20c8 = 0;
                }
                _crc = local_20c8;
                (entry_local->ae_stat).aest_mtime_nsec = name_utf8_buf._8188_4_;
                *(uint *)&(entry_local->ae_stat).field_0x2c = name_utf8_buf._8184_4_ + 0x32;
                *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s =
                     *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s & 0xfe |
                     (host_os & 0x40) != 0;
                if ((((ulong)entry_local[0xf].ae_fflags_text.aes_mbs.s & 1) == 0) ||
                   (*(long *)&(entry_local->ae_stat).aest_birthtime_nsec != 0)) {
                  if ((local_20c8 < 0x4000001) &&
                     (((*(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s >> 3 & 1) != 0 ||
                      (local_20c8 != 0)))) {
                    if (((((ulong)entry_local[0xf].ae_fflags_text.aes_mbs.s & 1) == 0) ||
                        ((long)entry_local[0x10].ae_uname.aes_utf8.buffer_length < 1)) ||
                       (entry_local[0x10].ae_uname.aes_utf8.buffer_length == local_20c8)) {
                      if (((entry_local->ae_stat).aest_birthtime < (long)local_20c8) &&
                         (*(long *)&(entry_local->ae_stat).aest_birthtime_nsec != 0)) {
                        pvVar2 = realloc(*(void **)&(entry_local->ae_stat).aest_birthtime_nsec,
                                         local_20c8);
                        if (pvVar2 == (void *)0x0) {
                          archive_set_error((archive *)rar_local,0x16,
                                            "Not enough memory when trying to realloc the window buffer."
                                           );
                          return L'\xffffffe2';
                        }
                        *(void **)&(entry_local->ae_stat).aest_birthtime_nsec = pvVar2;
                      }
                      (entry_local->ae_stat).aest_birthtime = _crc;
                      if ((((ulong)entry_local[0xf].ae_fflags_text.aes_mbs.s & 1) != 0) &&
                         (entry_local[0x10].ae_uname.aes_utf8.buffer_length == 0)) {
                        entry_local[0x10].ae_uname.aes_utf8.buffer_length =
                             (entry_local->ae_stat).aest_birthtime;
                      }
                      init_window_mask((rar5 *)entry_local);
                      *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s =
                           *(byte *)&entry_local[0xf].ae_fflags_text.aes_mbs.s & 0xfd;
                      wVar1 = read_var_sized((archive_read *)rar_local,&name_size,(size_t *)0x0);
                      if (wVar1 == L'\0') {
                        a_local._4_4_ = L'\x01';
                      }
                      else {
                        if (name_size == 0) {
                          if ((compression_info & 0x10) == 0) {
                            if ((compression_info & 1) == 0) {
                              fflags_text._4_4_ = 0x81a4;
                            }
                            else {
                              fflags_text._4_4_ = 0x8124;
                            }
                          }
                          else if ((compression_info & 1) == 0) {
                            fflags_text._4_4_ = 0x41ed;
                          }
                          else {
                            fflags_text._4_4_ = 0x416d;
                          }
                          archive_entry_set_mode
                                    ((archive_entry *)block_flags_local,fflags_text._4_4_);
                          if (((compression_info & 7) != 0) &&
                             (__dest = (char *)malloc(0x16), __dest != (char *)0x0)) {
                            pcStack_20b8 = __dest;
                            if ((compression_info & 1) != 0) {
                              strcpy(__dest,"rdonly,");
                              pcStack_20b8 = __dest + 7;
                            }
                            if ((compression_info & 2) != 0) {
                              strcpy(pcStack_20b8,"hidden,");
                              pcStack_20b8 = pcStack_20b8 + 7;
                            }
                            if ((compression_info & 4) != 0) {
                              strcpy(pcStack_20b8,"system,");
                              pcStack_20b8 = pcStack_20b8 + 7;
                            }
                            if (__dest < pcStack_20b8) {
                              pcStack_20b8[-1] = '\0';
                              archive_entry_copy_fflags_text
                                        ((archive_entry *)block_flags_local,__dest);
                            }
                            free(__dest);
                          }
                        }
                        else {
                          if (name_size != 1) {
                            archive_set_error((archive *)rar_local,0x54,"Unsupported Host OS: 0x%x",
                                              name_size & 0xffffffff);
                            return L'\xffffffe2';
                          }
                          archive_entry_set_mode
                                    ((archive_entry *)block_flags_local,(mode_t)compression_info);
                        }
                        wVar1 = read_var_sized((archive_read *)rar_local,&unpacked_size,
                                               (size_t *)0x0);
                        if (wVar1 == L'\0') {
                          a_local._4_4_ = L'\x01';
                        }
                        else {
                          wVar1 = read_ahead((archive_read *)rar_local,unpacked_size,
                                             (uint8_t **)&edata_size);
                          if (wVar1 == L'\0') {
                            a_local._4_4_ = L'\x01';
                          }
                          else if (unpacked_size < 0x800) {
                            if (unpacked_size == 0) {
                              archive_set_error((archive *)rar_local,0x54,"No filename specified");
                              a_local._4_4_ = L'\xffffffe2';
                            }
                            else {
                              memcpy(&p,(void *)edata_size,unpacked_size);
                              name_utf8_buf[unpacked_size - 8] = '\0';
                              wVar1 = consume((archive_read *)rar_local,unpacked_size);
                              if (wVar1 == L'\0') {
                                archive_entry_update_pathname_utf8
                                          ((archive_entry *)block_flags_local,(char *)&p);
                                if (((long)data_size < 1) ||
                                   (a_local._4_4_ =
                                         process_head_file_extra
                                                   ((archive_read *)rar_local,
                                                    (archive_entry *)block_flags_local,
                                                    (rar5 *)entry_local,data_size),
                                   a_local._4_4_ == L'\0')) {
                                  if (((file_attr & 8) == 0) &&
                                     (entry_local[0xf].ae_stat.aest_rdevmajor = window_size,
                                     entry_local[0x10].ae_uname.aes_utf8.s == (char *)0x0)) {
                                    archive_entry_set_size
                                              ((archive_entry *)block_flags_local,window_size);
                                  }
                                  if ((file_attr & 2) != 0) {
                                    archive_entry_set_mtime
                                              ((archive_entry *)block_flags_local,
                                               (ulong)(uint)c_method,0);
                                  }
                                  if ((file_attr & 4) != 0) {
                                    *(wchar_t *)
                                     ((long)&entry_local[0xf].ae_fflags_text.aes_utf8.length + 4) =
                                         c_version;
                                  }
                                  if (((byte)(entry_local->ae_stat).aest_mtime >> 2 & 1) == 0) {
                                    *(byte *)&(entry_local->ae_stat).aest_mtime =
                                         (byte)(entry_local->ae_stat).aest_mtime & 0xf7 | 8;
                                    *(byte *)&(entry_local->ae_stat).aest_mtime =
                                         (byte)(entry_local->ae_stat).aest_mtime & 0xfd | 2;
                                    *(byte *)&(entry_local->ae_stat).aest_mtime =
                                         (byte)(entry_local->ae_stat).aest_mtime & 0xfe;
                                  }
                                  if (((byte)(entry_local->ae_stat).aest_atime_nsec >> 1 & 1) == 0)
                                  {
                                    a_local._4_4_ = L'\0';
                                  }
                                  else {
                                    a_local._4_4_ = L'\xfffffff6';
                                  }
                                }
                              }
                              else {
                                a_local._4_4_ = L'\x01';
                              }
                            }
                          }
                          else {
                            archive_set_error((archive *)rar_local,0x54,"Filename is too long");
                            a_local._4_4_ = L'\xffffffe2';
                          }
                        }
                      }
                    }
                    else {
                      archive_set_error((archive *)rar_local,0x54,
                                        "Window size for this solid file doesn\'t match the window size used in previous solid file. "
                                       );
                      a_local._4_4_ = L'\xffffffe2';
                    }
                  }
                  else {
                    archive_set_error((archive *)rar_local,0x54,
                                      "Declared dictionary size is not supported.");
                    a_local._4_4_ = L'\xffffffe2';
                  }
                }
                else {
                  archive_set_error((archive *)rar_local,0x54,
                                    "Declared solid file, but no window buffer initialized yet.");
                  a_local._4_4_ = L'\xffffffe2';
                }
              }
            }
            else {
              a_local._4_4_ = L'\x01';
            }
          }
          else {
            a_local._4_4_ = L'\x01';
          }
        }
        else {
          archive_set_error((archive *)rar_local,0x16,
                            "Files with unknown unpacked size are not supported");
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int process_head_file(struct archive_read* a, struct rar5* rar,
    struct archive_entry* entry, size_t block_flags)
{
	ssize_t extra_data_size = 0;
	size_t data_size = 0;
	size_t file_flags = 0;
	size_t file_attr = 0;
	size_t compression_info = 0;
	size_t host_os = 0;
	size_t name_size = 0;
	uint64_t unpacked_size, window_size;
	uint32_t mtime = 0, crc = 0;
	int c_method = 0, c_version = 0;
	char name_utf8_buf[MAX_NAME_IN_BYTES];
	const uint8_t* p;

	enum FILE_FLAGS {
		DIRECTORY = 0x0001, UTIME = 0x0002, CRC32 = 0x0004,
		UNKNOWN_UNPACKED_SIZE = 0x0008,
	};

	enum FILE_ATTRS {
		ATTR_READONLY = 0x1, ATTR_HIDDEN = 0x2, ATTR_SYSTEM = 0x4,
		ATTR_DIRECTORY = 0x10,
	};

	enum COMP_INFO_FLAGS {
		SOLID = 0x0040,
	};

	enum HOST_OS {
		HOST_WINDOWS = 0,
		HOST_UNIX = 1,
	};

	archive_entry_clear(entry);

	/* Do not reset file context if we're switching archives. */
	if(!rar->cstate.switch_multivolume) {
		reset_file_context(rar);
	}

	if(block_flags & HFL_EXTRA_DATA) {
		size_t edata_size = 0;
		if(!read_var_sized(a, &edata_size, NULL))
			return ARCHIVE_EOF;

		/* Intentional type cast from unsigned to signed. */
		extra_data_size = (ssize_t) edata_size;
	}

	if(block_flags & HFL_DATA) {
		if(!read_var_sized(a, &data_size, NULL))
			return ARCHIVE_EOF;

		rar->file.bytes_remaining = data_size;
	} else {
		rar->file.bytes_remaining = 0;

		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"no data found in file/service block");
		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &file_flags, NULL))
		return ARCHIVE_EOF;

	if(!read_var(a, &unpacked_size, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UNKNOWN_UNPACKED_SIZE) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Files with unknown unpacked size are not supported");
		return ARCHIVE_FATAL;
	}

	rar->file.dir = (uint8_t) ((file_flags & DIRECTORY) > 0);

	if(!read_var_sized(a, &file_attr, NULL))
		return ARCHIVE_EOF;

	if(file_flags & UTIME) {
		if(!read_u32(a, &mtime))
			return ARCHIVE_EOF;
	}

	if(file_flags & CRC32) {
		if(!read_u32(a, &crc))
			return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &compression_info, NULL))
		return ARCHIVE_EOF;

	c_method = (int) (compression_info >> 7) & 0x7;
	c_version = (int) (compression_info & 0x3f);

	/* RAR5 seems to limit the dictionary size to 64MB. */
	window_size = (rar->file.dir > 0) ?
		0 :
		g_unpack_window_size << ((compression_info >> 10) & 15);
	rar->cstate.method = c_method;
	rar->cstate.version = c_version + 50;
	rar->file.solid = (compression_info & SOLID) > 0;

	/* Archives which declare solid files without initializing the window
	 * buffer first are invalid. */

	if(rar->file.solid > 0 && rar->cstate.window_buf == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Declared solid file, but no window buffer "
				  "initialized yet.");
		return ARCHIVE_FATAL;
	}

	/* Check if window_size is a sane value. Also, if the file is not
	 * declared as a directory, disallow window_size == 0. */
	if(window_size > (64 * 1024 * 1024) ||
	    (rar->file.dir == 0 && window_size == 0))
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Declared dictionary size is not supported.");
		return ARCHIVE_FATAL;
	}

	if(rar->file.solid > 0) {
		/* Re-check if current window size is the same as previous
		 * window size (for solid files only). */
		if(rar->file.solid_window_size > 0 &&
		    rar->file.solid_window_size != (ssize_t) window_size)
		{
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Window size for this solid file doesn't match "
			    "the window size used in previous solid file. ");
			return ARCHIVE_FATAL;
		}
	}

	if(rar->cstate.window_size < (ssize_t) window_size &&
	    rar->cstate.window_buf)
	{
		/* If window_buf has been allocated before, reallocate it, so
		 * that its size will match new window_size. */

		uint8_t* new_window_buf =
			realloc(rar->cstate.window_buf, window_size);

		if(!new_window_buf) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
				"Not enough memory when trying to realloc the window "
				"buffer.");
			return ARCHIVE_FATAL;
		}

		rar->cstate.window_buf = new_window_buf;
	}

	/* Values up to 64M should fit into ssize_t on every
	 * architecture. */
	rar->cstate.window_size = (ssize_t) window_size;

	if(rar->file.solid > 0 && rar->file.solid_window_size == 0) {
		/* Solid files have to have the same window_size across
		   whole archive. Remember the window_size parameter
		   for first solid file found. */
		rar->file.solid_window_size = rar->cstate.window_size;
	}

	init_window_mask(rar);

	rar->file.service = 0;

	if(!read_var_sized(a, &host_os, NULL))
		return ARCHIVE_EOF;

	if(host_os == HOST_WINDOWS) {
		/* Host OS is Windows */

		__LA_MODE_T mode;

		if(file_attr & ATTR_DIRECTORY) {
			if (file_attr & ATTR_READONLY) {
				mode = 0555 | AE_IFDIR;
			} else {
				mode = 0755 | AE_IFDIR;
			}
		} else {
			if (file_attr & ATTR_READONLY) {
				mode = 0444 | AE_IFREG;
			} else {
				mode = 0644 | AE_IFREG;
			}
		}

		archive_entry_set_mode(entry, mode);

		if (file_attr & (ATTR_READONLY | ATTR_HIDDEN | ATTR_SYSTEM)) {
			char *fflags_text, *ptr;
			/* allocate for "rdonly,hidden,system," */
			fflags_text = malloc(22 * sizeof(char));
			if (fflags_text != NULL) {
				ptr = fflags_text;
				if (file_attr & ATTR_READONLY) {
					strcpy(ptr, "rdonly,");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_HIDDEN) {
					strcpy(ptr, "hidden,");
					ptr = ptr + 7;
				}
				if (file_attr & ATTR_SYSTEM) {
					strcpy(ptr, "system,");
					ptr = ptr + 7;
				}
				if (ptr > fflags_text) {
					/* Delete trailing comma */
					*(ptr - 1) = '\0';
					archive_entry_copy_fflags_text(entry,
					    fflags_text);
				}
				free(fflags_text);
			}
		}
	} else if(host_os == HOST_UNIX) {
		/* Host OS is Unix */
		archive_entry_set_mode(entry, (__LA_MODE_T) file_attr);
	} else {
		/* Unknown host OS */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Unsupported Host OS: 0x%x", (int) host_os);

		return ARCHIVE_FATAL;
	}

	if(!read_var_sized(a, &name_size, NULL))
		return ARCHIVE_EOF;

	if(!read_ahead(a, name_size, &p))
		return ARCHIVE_EOF;

	if(name_size > (MAX_NAME_IN_CHARS - 1)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"Filename is too long");

		return ARCHIVE_FATAL;
	}

	if(name_size == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				"No filename specified");

		return ARCHIVE_FATAL;
	}

	memcpy(name_utf8_buf, p, name_size);
	name_utf8_buf[name_size] = 0;
	if(ARCHIVE_OK != consume(a, name_size)) {
		return ARCHIVE_EOF;
	}

	archive_entry_update_pathname_utf8(entry, name_utf8_buf);

	if(extra_data_size > 0) {
		int ret = process_head_file_extra(a, entry, rar,
		    extra_data_size);

		/*
		 * TODO: rewrite or remove useless sanity check
		 *       as extra_data_size is not passed as a pointer
		 *
		if(extra_data_size < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			    "File extra data size is not zero");
			return ARCHIVE_FATAL;
		}
		 */

		if(ret != ARCHIVE_OK)
			return ret;
	}

	if((file_flags & UNKNOWN_UNPACKED_SIZE) == 0) {
		rar->file.unpacked_size = (ssize_t) unpacked_size;
		if(rar->file.redir_type == REDIR_TYPE_NONE)
			archive_entry_set_size(entry, unpacked_size);
	}

	if(file_flags & UTIME) {
		archive_entry_set_mtime(entry, (time_t) mtime, 0);
	}

	if(file_flags & CRC32) {
		rar->file.stored_crc32 = crc;
	}

	if(!rar->cstate.switch_multivolume) {
		/* Do not reinitialize unpacking state if we're switching
		 * archives. */
		rar->cstate.block_parsing_finished = 1;
		rar->cstate.all_filters_applied = 1;
		rar->cstate.initialized = 0;
	}

	if(rar->generic.split_before > 0) {
		/* If now we're standing on a header that has a 'split before'
		 * mark, it means we're standing on a 'continuation' file
		 * header. Signal the caller that if it wants to move to
		 * another file, it must call rar5_read_header() function
		 * again. */

		return ARCHIVE_RETRY;
	} else {
		return ARCHIVE_OK;
	}
}